

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.h
# Opt level: O1

void __thiscall IR::LabelInstr::LabelInstr(LabelInstr *this,JitArenaAllocator *allocator)

{
  undefined1 *puVar1;
  
  (this->super_Instr).m_noLazyHelperAssert = false;
  (this->super_Instr).m_next = (Instr *)0x0;
  (this->super_Instr).m_prev = (Instr *)0x0;
  (this->super_Instr).m_func = (Func *)0x0;
  (this->super_Instr).globOptInstrString = (char16 *)0x0;
  (this->super_Instr).m_opcode = MaxByteSizedOpcodes;
  (this->super_Instr).ignoreOverflowBitCount = ' ';
  (this->super_Instr).highlight = 0;
  puVar1 = &(this->super_Instr).field_0x36;
  *(ushort *)puVar1 = *(ushort *)puVar1 & 1;
  puVar1 = &(this->super_Instr).field_0x38;
  *puVar1 = *puVar1 & 0x80;
  (this->super_Instr).m_number = 0xffffffff;
  (this->super_Instr).m_dst = (Opnd *)0x0;
  (this->super_Instr).m_src1 = (Opnd *)0x0;
  (this->super_Instr).m_src2 = (Opnd *)0x0;
  (this->super_Instr)._vptr_Instr = (_func_int **)&PTR_Dump_014ea748;
  (this->labelRefs).super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
  super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.super_RealCount.count = 0;
  (this->labelRefs).super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
  super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
  super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)&this->labelRefs;
  (this->labelRefs).super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.allocator =
       &allocator->super_ArenaAllocator;
  this->field_0x78 = this->field_0x78 & 0xc0;
  this->m_region = (Region *)0x0;
  *(undefined4 *)((long)&this->m_block + 4) = 0;
  *(undefined8 *)((long)&this->m_name + 4) = 0;
  *(undefined8 *)((long)&this->m_pc + 4) = 0;
  *(undefined8 *)&this->m_id = 0;
  *(undefined8 *)((long)&this->m_loweredBasicBlock + 4) = 0;
  return;
}

Assistant:

LabelInstr(JitArenaAllocator * allocator) : Instr(), labelRefs(allocator), m_isLoopTop(false), m_block(nullptr), isOpHelper(false),
        m_hasNonBranchRef(false), m_region(nullptr), m_loweredBasicBlock(nullptr), m_isDataLabel(false), m_isForInExit(false)
#if DBG
        , m_noHelperAssert(false)
        , m_name(nullptr)
#endif
    {
#if DBG_DUMP
        m_id = 0;
#endif
        m_pc.pc = nullptr;
    }